

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O3

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<float,_float>,_Eigen::internal::redux_evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_3,_0>
       ::run(redux_evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *mat,
            scalar_sum_op<float,_float> *func)

{
  float *pfVar1;
  Scalar *pSVar2;
  ulong uVar3;
  Index index;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  Scalar SVar7;
  Scalar SVar8;
  Scalar SVar9;
  Scalar SVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  
  pSVar2 = (mat->m_evaluator).
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>.m_data
  ;
  uVar3 = (mat->m_xpr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols * (mat->m_xpr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
  uVar5 = uVar3;
  uVar6 = uVar3;
  if ((long)uVar3 < 0) {
    uVar5 = uVar3 + 3;
    uVar6 = uVar3 + 7;
  }
  if (uVar3 + 3 < 7) {
    SVar7 = *pSVar2;
    if (1 < (long)uVar3) {
      lVar4 = 1;
      do {
        SVar7 = SVar7 + pSVar2[lVar4];
        lVar4 = lVar4 + 1;
      } while (uVar3 - lVar4 != 0);
    }
  }
  else {
    uVar5 = uVar5 & 0xfffffffffffffffc;
    SVar7 = *pSVar2;
    SVar8 = pSVar2[1];
    SVar9 = pSVar2[2];
    SVar10 = pSVar2[3];
    if (7 < (long)uVar3) {
      uVar6 = uVar6 & 0xfffffffffffffff8;
      uVar11 = *(undefined8 *)(pSVar2 + 4);
      uVar12 = *(undefined8 *)(pSVar2 + 6);
      if (0xf < uVar3) {
        lVar4 = 8;
        do {
          pfVar1 = pSVar2 + lVar4;
          SVar7 = SVar7 + *pfVar1;
          SVar8 = SVar8 + pfVar1[1];
          SVar9 = SVar9 + pfVar1[2];
          SVar10 = SVar10 + pfVar1[3];
          pfVar1 = pSVar2 + lVar4 + 4;
          uVar11 = CONCAT44((float)((ulong)uVar11 >> 0x20) + pfVar1[1],(float)uVar11 + *pfVar1);
          uVar12 = CONCAT44((float)((ulong)uVar12 >> 0x20) + pfVar1[3],(float)uVar12 + pfVar1[2]);
          lVar4 = lVar4 + 8;
        } while (lVar4 < (long)uVar6);
      }
      SVar7 = (float)uVar11 + SVar7;
      SVar8 = (float)((ulong)uVar11 >> 0x20) + SVar8;
      SVar9 = (float)uVar12 + SVar9;
      SVar10 = (float)((ulong)uVar12 >> 0x20) + SVar10;
      if ((long)uVar6 < (long)uVar5) {
        pfVar1 = pSVar2 + uVar6;
        SVar7 = SVar7 + *pfVar1;
        SVar8 = SVar8 + pfVar1[1];
        SVar9 = SVar9 + pfVar1[2];
        SVar10 = SVar10 + pfVar1[3];
      }
    }
    SVar7 = SVar10 + SVar8 + SVar9 + SVar7;
    if ((long)uVar5 < (long)uVar3) {
      do {
        SVar7 = SVar7 + pSVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 - uVar5 != 0);
    }
  }
  return SVar7;
}

Assistant:

static Scalar run(const Derived &mat, const Func& func)
  {
    const Index size = mat.size();
    
    const Index packetSize = redux_traits<Func, Derived>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Derived::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Derived::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(mat.nestedExpression());
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }